

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O2

void dtc::push_string(byte_buffer *buffer,string *s,bool escapes)

{
  ulong uVar1;
  ulong uVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined3 in_register_00000011;
  undefined4 uVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  uint8_t c;
  byte local_49;
  string *local_48;
  undefined4 local_3c;
  byte_buffer *local_38;
  
  uVar8 = CONCAT31(in_register_00000011,escapes);
  uVar2 = s->_M_string_length;
  uVar10 = 0;
  local_48 = s;
  local_3c = uVar8;
  local_38 = buffer;
  while (uVar10 < uVar2) {
    pcVar3 = (s->_M_dataplus)._M_p;
    bVar11 = pcVar3[uVar10];
    uVar9 = uVar10;
    if ((((char)uVar8 != '\0') && (bVar11 == 0x5c)) && (uVar1 = uVar10 + 1, uVar1 < uVar2)) {
      local_49 = pcVar3[uVar1];
      uVar6 = (uint)local_49;
      uVar9 = uVar1;
      if (local_49 - 0x30 < 8) {
        iVar5 = anon_unknown.dwarf_acf92::digittoint(uVar6);
        uVar1 = uVar10 + 2;
        s = local_48;
        uVar8 = local_3c;
        bVar11 = (byte)iVar5;
        if ((uVar1 < uVar2) && ((pcVar3[uVar1] & 0xf8U) == 0x30)) {
          uVar6 = anon_unknown.dwarf_acf92::digittoint((uint)(byte)pcVar3[uVar1]);
          uVar6 = uVar6 | iVar5 << 3;
          bVar11 = (byte)uVar6;
          uVar9 = uVar1;
          s = local_48;
          uVar8 = local_3c;
          if ((uVar10 + 3 < uVar2) && ((pcVar3[uVar10 + 3] & 0xf8U) == 0x30)) {
            iVar5 = anon_unknown.dwarf_acf92::digittoint((uint)(byte)pcVar3[uVar10 + 3]);
            s = local_48;
            uVar8 = local_3c;
            bVar11 = (byte)(uVar6 << 3) | (byte)iVar5;
          }
        }
      }
      else {
        bVar11 = local_49;
        switch(local_49) {
        case 0x6e:
          local_49 = 10;
          bVar11 = local_49;
          break;
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x73:
        case 0x75:
        case 0x77:
          break;
        case 0x72:
          local_49 = 0xd;
          bVar11 = local_49;
          break;
        case 0x74:
          local_49 = 9;
          bVar11 = local_49;
          break;
        case 0x76:
          local_49 = 0xb;
          bVar11 = local_49;
          break;
        case 0x78:
          uVar9 = uVar10 + 2;
          if (uVar9 < uVar2) {
            iVar5 = anon_unknown.dwarf_acf92::digittoint((int)pcVar3[uVar10 + 2]);
            uVar10 = uVar10 + 3;
            s = local_48;
            bVar11 = (byte)iVar5;
            if ((uVar10 < uVar2) && (bVar4 = ishexdigit(pcVar3[uVar10]), s = local_48, bVar4)) {
              iVar7 = anon_unknown.dwarf_acf92::digittoint
                                ((int)(local_48->_M_dataplus)._M_p[uVar10]);
              uVar9 = uVar10;
              s = local_48;
              bVar11 = (byte)(iVar5 << 4) | (byte)iVar7;
            }
          }
          break;
        default:
          if (uVar6 == 0x66) {
            local_49 = 0xc;
            bVar11 = local_49;
          }
          else if (uVar6 == 0x62) {
            local_49 = 8;
            bVar11 = local_49;
          }
          else if (uVar6 == 0x61) {
            local_49 = 7;
            bVar11 = local_49;
          }
        }
      }
    }
    local_49 = bVar11;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(local_38,&local_49);
    uVar10 = uVar9 + 1;
  }
  return;
}

Assistant:

void
push_string(byte_buffer &buffer, const string &s, bool escapes)
{
	size_t length = s.size();
	for (size_t i=0 ; i<length ; ++i)
	{
		uint8_t c = s[i];
		if (escapes && c == '\\' && i+1 < length)
		{
			c = s[++i];
			switch (c)
			{
				// For now, we just ignore invalid escape sequences.
				default:
				case '"':
				case '\'':
				case '\\':
					break;
				case 'a':
					c = '\a';
					break;
				case 'b':
					c = '\b';
					break;
				case 't':
					c = '\t';
					break;
				case 'n':
					c = '\n';
					break;
				case 'v':
					c = '\v';
					break;
				case 'f':
					c = '\f';
					break;
				case 'r':
					c = '\r';
					break;
				case '0'...'7':
				{
					int v = digittoint(c);
					if (i+1 < length && s[i+1] <= '7' && s[i+1] >= '0')
					{
						v <<= 3;
						v |= digittoint(s[i+1]);
						i++;
						if (i+1 < length && s[i+1] <= '7' && s[i+1] >= '0')
						{
							v <<= 3;
							v |= digittoint(s[i+1]);
						}
					}
					c = (uint8_t)v;
					break;
				}
				case 'x':
				{
					++i;
					if (i >= length)
					{
						break;
					}
					int v = digittoint(s[i]);
					if (i+1 < length && ishexdigit(s[i+1]))
					{
						v <<= 4;
						v |= digittoint(s[++i]);
					}
					c = (uint8_t)v;
					break;
				}
			}
		}
		buffer.push_back(c);
	}
}